

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O0

void smallest_combine_accum_help(int x,int *accum)

{
  int *accum_local;
  int x_local;
  
  if (x != 0x7ffffffe) {
    if (x == 0x7fffffff) {
      if (*accum == 0x7ffffffe) {
        *accum = 0x7fffffff;
      }
    }
    else if (((*accum == 0x7fffffff) || (*accum == 0x7ffffffe)) || (x < *accum)) {
      *accum = x;
    }
  }
  return;
}

Assistant:

static void smallest_combine_accum_help(int x, int *accum)
{
	if (x == UI_ENTRY_VALUE_NOT_PRESENT) {
		return;
	}
	if (x == UI_ENTRY_UNKNOWN_VALUE) {
		if (*accum == UI_ENTRY_VALUE_NOT_PRESENT) {
			*accum = UI_ENTRY_UNKNOWN_VALUE;
		}
		return;
	}
	if (*accum == UI_ENTRY_UNKNOWN_VALUE ||
		*accum == UI_ENTRY_VALUE_NOT_PRESENT || *accum > x) {
		*accum = x;
	}
}